

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comments.cpp
# Opt level: O2

void __thiscall
Comments_EmptyDocumentWithComments_Test::Comments_EmptyDocumentWithComments_Test
          (Comments_EmptyDocumentWithComments_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001abf18;
  return;
}

Assistant:

TEST(Comments, EmptyDocumentWithComments) {
    std::istringstream input("#first comment\n\n   \t# second\r\n\r\n #last one without new-line after it");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::comment, "first comment"},
        {sax_event_t::comment, " second"},
        {sax_event_t::comment, "last one without new-line after it"},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}